

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

int RSA_set0_factors(RSA *r,BIGNUM *p,BIGNUM *q)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (((*(long *)(in_RDI + 0x40) == 0) && (in_RSI == 0)) ||
     ((*(long *)(in_RDI + 0x48) == 0 && (in_RDX == 0)))) {
    local_4 = 0;
  }
  else {
    if (in_RSI != 0) {
      BN_clear_free(*(BIGNUM **)(in_RDI + 0x40));
      *(long *)(in_RDI + 0x40) = in_RSI;
      BN_set_flags(*(BIGNUM **)(in_RDI + 0x40),4);
    }
    if (in_RDX != 0) {
      BN_clear_free(*(BIGNUM **)(in_RDI + 0x48));
      *(long *)(in_RDI + 0x48) = in_RDX;
      BN_set_flags(*(BIGNUM **)(in_RDI + 0x48),4);
    }
    *(int *)(in_RDI + 0xd8) = *(int *)(in_RDI + 0xd8) + 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int RSA_set0_factors(RSA *r, BIGNUM *p, BIGNUM *q)
{
    /* If the fields p and q in r are NULL, the corresponding input
     * parameters MUST be non-NULL.
     */
    if ((r->p == NULL && p == NULL)
        || (r->q == NULL && q == NULL))
        return 0;

    if (p != NULL) {
        BN_clear_free(r->p);
        r->p = p;
        BN_set_flags(r->p, BN_FLG_CONSTTIME);
    }
    if (q != NULL) {
        BN_clear_free(r->q);
        r->q = q;
        BN_set_flags(r->q, BN_FLG_CONSTTIME);
    }
    r->dirty_cnt++;

    return 1;
}